

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  undefined1 *puVar2;
  ulong *puVar3;
  VectorType VVar4;
  VectorType VVar5;
  unsigned_long *puVar6;
  long *plVar7;
  SelectionVector *count;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var11;
  sel_t *psVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  element_type *peVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  reference vector;
  reference vector_00;
  long lVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  SelectionVector *pSVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  SelectionVector *pSVar22;
  ulong uVar23;
  data_ptr_t pdVar24;
  SelectionVector *pSVar25;
  unsigned_long uVar26;
  ValidityMask *other;
  idx_t idx_in_entry;
  ulong uVar27;
  data_ptr_t pdVar28;
  UnifiedVectorFormat ldata;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  data_ptr_t local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar4 = vector->vector_type;
  VVar5 = vector_00->vector_type;
  if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar7 = (long *)result->data;
    if (((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) &&
       ((puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar6 == (unsigned_long *)0x0 || ((*puVar6 & 1) != 0)))) {
      lVar18 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined8 *)vector_00->data,&result->validity,0);
      *plVar7 = lVar18;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar28 = vector->data;
      pdVar8 = vector_00->data;
      puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar9 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          _Var21._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar24 = local_c8.data;
          pSVar25 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar24;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var21._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
        if (_Var21._M_head_impl != (unsigned_long *)0x0) {
          puVar2 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar2 < (undefined1 *)0x40) {
            return;
          }
          uVar23 = 0;
          pSVar25 = (SelectionVector *)0x0;
          do {
            puVar6 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar6 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar6[uVar23];
            }
            pSVar20 = (SelectionVector *)
                      &pSVar25[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar20) {
              pSVar20 = count;
            }
            pSVar22 = pSVar20;
            if (uVar26 != 0) {
              pSVar22 = pSVar25;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar25 < pSVar20) {
                  uVar13 = *(undefined8 *)pdVar8;
                  pdVar24 = pdVar28 + (long)pSVar25 * 0x10 + 8;
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (*(undefined8 *)(pdVar24 + -8),*(undefined8 *)pdVar24,uVar13,
                                        pVVar1,pSVar22);
                    *(long *)(pdVar9 + (long)pSVar22 * 8) = lVar18;
                    pSVar22 = (SelectionVector *)((long)&pSVar22->sel_vector + 1);
                    pdVar24 = pdVar24 + 0x10;
                  } while (pSVar20 != pSVar22);
                }
              }
              else if (pSVar25 < pSVar20) {
                pdVar24 = pdVar28 + (long)pSVar25 * 0x10 + 8;
                uVar27 = 0;
                do {
                  if ((uVar26 >> (uVar27 & 0x3f) & 1) != 0) {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (*(undefined8 *)(pdVar24 + -8),*(undefined8 *)pdVar24,
                                        *(undefined8 *)pdVar8,pVVar1,
                                        (long)&pSVar25->sel_vector + uVar27);
                    *(long *)(pdVar9 + uVar27 * 8 + (long)pSVar25 * 8) = lVar18;
                  }
                  uVar27 = uVar27 + 1;
                  pdVar24 = pdVar24 + 0x10;
                } while ((long)pSVar25 + (uVar27 - (long)pSVar20) != 0);
                pSVar22 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar27);
              }
            }
            uVar23 = uVar23 + 1;
            pSVar25 = pSVar22;
          } while (uVar23 != (ulong)puVar2 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar13 = *(undefined8 *)pdVar8;
        pdVar28 = pdVar28 + 8;
        pSVar25 = (SelectionVector *)0x0;
        do {
          lVar18 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                             (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,uVar13,pVVar1,
                              pSVar25);
          *(long *)(pdVar9 + (long)pSVar25 * 8) = lVar18;
          pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
          pdVar28 = pdVar28 + 0x10;
        } while (count != pSVar25);
        return;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar5 != FLAT_VECTOR) {
        if (VVar5 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar28 = vector->data;
          pdVar8 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar9 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
          if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78.sel = count;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            _Var21._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_78.sel = count;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                       (unsigned_long *)&local_78);
            pdVar24 = local_c8.data;
            pSVar25 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar25;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar24;
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var21._M_head_impl =
                 (pTVar19->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
          FlatVector::VerifyFlatVector(vector_00);
          other = &vector_00->validity;
          if (_Var21._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_78.sel = count;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              }
              _Var21._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_78.sel = count;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)other,(unsigned_long *)&local_78);
              pdVar24 = local_c8.data;
              pSVar25 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar25;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar24;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var21._M_head_impl =
                   (pTVar19->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl
            ;
          }
          else {
            ValidityMask::Combine(pVVar1,other,(idx_t)count);
          }
          if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              pdVar28 = pdVar28 + 8;
              pSVar25 = (SelectionVector *)0x0;
              do {
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                   (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,
                                    *(undefined8 *)(pdVar8 + (long)pSVar25 * 8),pVVar1,pSVar25);
                *(long *)(pdVar9 + (long)pSVar25 * 8) = lVar18;
                pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
                pdVar28 = pdVar28 + 0x10;
              } while (count != pSVar25);
            }
          }
          else {
            puVar2 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar2) {
              pdVar28 = pdVar28 + 8;
              uVar23 = 0;
              pSVar25 = (SelectionVector *)0x0;
              local_d8 = pdVar28;
              do {
                puVar6 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar6 == (unsigned_long *)0x0) {
                  uVar26 = 0xffffffffffffffff;
                }
                else {
                  uVar26 = puVar6[uVar23];
                }
                pSVar20 = (SelectionVector *)
                          &pSVar25[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
                pSVar22 = pSVar20;
                if (uVar26 != 0) {
                  pSVar22 = pSVar25;
                  if (uVar26 == 0xffffffffffffffff) {
                    if (pSVar25 < pSVar20) {
                      pdVar24 = pdVar28 + (long)pSVar25 * 0x10;
                      do {
                        lVar18 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                           (*(undefined8 *)(pdVar24 + -8),*(undefined8 *)pdVar24,
                                            *(undefined8 *)(pdVar8 + (long)pSVar25 * 8),pVVar1,
                                            pSVar25);
                        *(long *)(pdVar9 + (long)pSVar25 * 8) = lVar18;
                        pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
                        pdVar24 = pdVar24 + 0x10;
                        pSVar22 = pSVar25;
                      } while (pSVar20 != pSVar25);
                    }
                  }
                  else if (pSVar25 < pSVar20) {
                    pdVar28 = pdVar28 + (long)pSVar25 * 0x10;
                    uVar27 = 0;
                    do {
                      if ((uVar26 >> (uVar27 & 0x3f) & 1) != 0) {
                        lVar18 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                           (*(undefined8 *)(pdVar28 + -8),*(undefined8 *)pdVar28,
                                            *(undefined8 *)(pdVar8 + uVar27 * 8 + (long)pSVar25 * 8)
                                            ,pVVar1,(long)&pSVar25->sel_vector + uVar27);
                        *(long *)(pdVar9 + uVar27 * 8 + (long)pSVar25 * 8) = lVar18;
                      }
                      uVar27 = uVar27 + 1;
                      pdVar28 = pdVar28 + 0x10;
                    } while ((long)pSVar25 + (uVar27 - (long)pSVar20) != 0);
                    pSVar22 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar27);
                    pdVar28 = local_d8;
                  }
                }
                uVar23 = uVar23 + 1;
                pSVar25 = pSVar22;
              } while (uVar23 != (ulong)puVar2 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_c8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar28 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var11._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar12 = (local_78.sel)->sel_vector;
              pSVar25 = (SelectionVector *)0x0;
              do {
                pSVar20 = pSVar25;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var11._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar20 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var11._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar25 * 4);
                }
                pSVar22 = pSVar25;
                if (psVar12 != (sel_t *)0x0) {
                  pSVar22 = (SelectionVector *)(ulong)psVar12[(long)pSVar25];
                }
                uVar14._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_use_count;
                uVar14._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar20 * 0x10))->_vptr__Sp_counted_base,
                                    uVar14,*(undefined8 *)(local_78.data + (long)pSVar22 * 8),pVVar1
                                    ,pSVar25);
                *(long *)(pdVar28 + (long)pSVar25 * 8) = lVar18;
                pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
              } while (count != pSVar25);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var11._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar12 = (local_78.sel)->sel_vector;
            pSVar25 = (SelectionVector *)0x0;
            do {
              pSVar20 = pSVar25;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var11._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar20 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var11._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar25 * 4);
              }
              pSVar22 = pSVar25;
              if (psVar12 != (sel_t *)0x0) {
                pSVar22 = (SelectionVector *)(ulong)psVar12[(long)pSVar25];
              }
              if (((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar20 >> 6] >> ((ulong)pSVar20 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar22 >> 6] >> ((ulong)pSVar22 & 0x3f) & 1) != 0)))) {
                uVar13._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_use_count;
                uVar13._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar20 * 0x10))->_vptr__Sp_counted_base,
                                    uVar13,*(undefined8 *)(local_78.data + (long)pSVar22 * 8),pVVar1
                                    ,pSVar25);
                *(long *)(pdVar28 + (long)pSVar25 * 8) = lVar18;
              }
              else {
                if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var17 = p_Stack_e0;
                  peVar16 = local_e8;
                  local_e8 = (element_type *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar16;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var17;
                  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                  }
                  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar19->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar15 = (byte)pSVar25 & 0x3f;
                puVar3 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                         ((ulong)pSVar25 >> 6);
                *puVar3 = *puVar3 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
              }
              pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
            } while (count != pSVar25);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar28 = vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar8 = vector_00->data;
      if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar9 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          _Var21._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar24 = local_c8.data;
          pSVar25 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar24;
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var21._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
        if (_Var21._M_head_impl != (unsigned_long *)0x0) {
          puVar2 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar2 < (undefined1 *)0x40) {
            return;
          }
          uVar23 = 0;
          pSVar25 = (SelectionVector *)0x0;
          do {
            puVar6 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar6 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar6[uVar23];
            }
            pSVar20 = (SelectionVector *)
                      &pSVar25[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar20) {
              pSVar20 = count;
            }
            pSVar22 = pSVar20;
            if (uVar26 != 0) {
              pSVar22 = pSVar25;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar25 < pSVar20) {
                  uVar13 = *(undefined8 *)pdVar28;
                  uVar14 = *(undefined8 *)(pdVar28 + 8);
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (uVar13,uVar14,*(undefined8 *)(pdVar8 + (long)pSVar22 * 8),
                                        pVVar1,pSVar22);
                    *(long *)(pdVar9 + (long)pSVar22 * 8) = lVar18;
                    pSVar22 = (SelectionVector *)((long)&pSVar22->sel_vector + 1);
                  } while (pSVar20 != pSVar22);
                }
              }
              else if (pSVar25 < pSVar20) {
                uVar27 = 0;
                do {
                  if ((uVar26 >> (uVar27 & 0x3f) & 1) != 0) {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                                       (*(undefined8 *)pdVar28,*(undefined8 *)(pdVar28 + 8),
                                        *(undefined8 *)(pdVar8 + uVar27 * 8 + (long)pSVar25 * 8),
                                        pVVar1,(long)&pSVar25->sel_vector + uVar27);
                    *(long *)(pdVar9 + uVar27 * 8 + (long)pSVar25 * 8) = lVar18;
                  }
                  uVar27 = uVar27 + 1;
                } while ((long)pSVar25 + (uVar27 - (long)pSVar20) != 0);
                pSVar22 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar27);
              }
            }
            uVar23 = uVar23 + 1;
            pSVar25 = pSVar22;
          } while (uVar23 != (ulong)puVar2 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar13 = *(undefined8 *)pdVar28;
        uVar14 = *(undefined8 *)(pdVar28 + 8);
        pSVar25 = (SelectionVector *)0x0;
        do {
          lVar18 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::timestamp_t,long>
                             (uVar13,uVar14,*(undefined8 *)(pdVar8 + (long)pSVar25 * 8),pVVar1,
                              pSVar25);
          *(long *)(pdVar9 + (long)pSVar25 * 8) = lVar18;
          pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
        } while (count != pSVar25);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}